

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_sse4.c
# Opt level: O2

uint aom_obmc_sad16x8_sse4_1(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *msk)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar6 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar7 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar5 = (undefined1  [16])0x0;
  auVar6 = pmovsxwd(in_XMM1,0x800080008000800);
  uVar3 = 0;
  do {
    auVar7 = pmovzxbd(in_XMM2,*(undefined4 *)(pre + uVar3 + 4));
    piVar1 = wsrc + uVar3;
    auVar8 = pmovzxbd(in_XMM4,*(undefined4 *)(pre + uVar3));
    piVar2 = wsrc + uVar3 + 4;
    in_XMM4 = pmaddwd(auVar8,*(undefined1 (*) [16])(msk + uVar3));
    auVar8._0_4_ = *piVar1 - in_XMM4._0_4_;
    auVar8._4_4_ = piVar1[1] - in_XMM4._4_4_;
    auVar8._8_4_ = piVar1[2] - in_XMM4._8_4_;
    auVar8._12_4_ = piVar1[3] - in_XMM4._12_4_;
    auVar7 = pmaddwd(auVar7,*(undefined1 (*) [16])(msk + uVar3 + 4));
    auVar9._0_4_ = *piVar2 - auVar7._0_4_;
    auVar9._4_4_ = piVar2[1] - auVar7._4_4_;
    auVar9._8_4_ = piVar2[2] - auVar7._8_4_;
    auVar9._12_4_ = piVar2[3] - auVar7._12_4_;
    auVar7 = pabsd(auVar7,auVar8);
    in_XMM2._0_4_ = ((uint)(auVar7._0_4_ + auVar6._0_4_) >> 0xc) + auVar5._0_4_;
    in_XMM2._4_4_ = ((uint)(auVar7._4_4_ + auVar6._4_4_) >> 0xc) + auVar5._4_4_;
    in_XMM2._8_4_ = ((uint)(auVar7._8_4_ + auVar6._8_4_) >> 0xc) + auVar5._8_4_;
    in_XMM2._12_4_ = ((uint)(auVar7._12_4_ + auVar6._12_4_) >> 0xc) + auVar5._12_4_;
    auVar7 = pabsd(auVar5,auVar9);
    auVar5._0_4_ = ((uint)(auVar7._0_4_ + auVar6._0_4_) >> 0xc) + in_XMM2._0_4_;
    auVar5._4_4_ = ((uint)(auVar7._4_4_ + auVar6._4_4_) >> 0xc) + in_XMM2._4_4_;
    auVar5._8_4_ = ((uint)(auVar7._8_4_ + auVar6._8_4_) >> 0xc) + in_XMM2._8_4_;
    auVar5._12_4_ = ((uint)(auVar7._12_4_ + auVar6._12_4_) >> 0xc) + in_XMM2._12_4_;
    pre = pre + ((long)(uVar3 << 0x3c) >> 0x3f & (long)(pre_stride + -0x10));
    bVar4 = uVar3 < 0x78;
    uVar3 = uVar3 + 8;
  } while (bVar4);
  auVar5 = phaddd(auVar5,auVar5);
  auVar5 = phaddd(auVar5,auVar5);
  return auVar5._0_4_;
}

Assistant:

static AOM_FORCE_INLINE unsigned int obmc_sad_w8n(
    const uint8_t *pre, const int pre_stride, const int32_t *wsrc,
    const int32_t *mask, const int width, const int height) {
  const int pre_step = pre_stride - width;
  int n = 0;
  __m128i v_sad_d = _mm_setzero_si128();

  assert(width >= 8);
  assert(IS_POWER_OF_TWO(width));

  do {
    const __m128i v_p1_b = xx_loadl_32(pre + n + 4);
    const __m128i v_m1_d = xx_load_128(mask + n + 4);
    const __m128i v_w1_d = xx_load_128(wsrc + n + 4);
    const __m128i v_p0_b = xx_loadl_32(pre + n);
    const __m128i v_m0_d = xx_load_128(mask + n);
    const __m128i v_w0_d = xx_load_128(wsrc + n);

    const __m128i v_p0_d = _mm_cvtepu8_epi32(v_p0_b);
    const __m128i v_p1_d = _mm_cvtepu8_epi32(v_p1_b);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m128i v_pm0_d = _mm_madd_epi16(v_p0_d, v_m0_d);
    const __m128i v_pm1_d = _mm_madd_epi16(v_p1_d, v_m1_d);

    const __m128i v_diff0_d = _mm_sub_epi32(v_w0_d, v_pm0_d);
    const __m128i v_diff1_d = _mm_sub_epi32(v_w1_d, v_pm1_d);
    const __m128i v_absdiff0_d = _mm_abs_epi32(v_diff0_d);
    const __m128i v_absdiff1_d = _mm_abs_epi32(v_diff1_d);

    // Rounded absolute difference
    const __m128i v_rad0_d = xx_roundn_epu32(v_absdiff0_d, 12);
    const __m128i v_rad1_d = xx_roundn_epu32(v_absdiff1_d, 12);

    v_sad_d = _mm_add_epi32(v_sad_d, v_rad0_d);
    v_sad_d = _mm_add_epi32(v_sad_d, v_rad1_d);

    n += 8;

    if (n % width == 0) pre += pre_step;
  } while (n < width * height);

  return xx_hsum_epi32_si32(v_sad_d);
}